

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O0

bool __thiscall QToolBar::event(QToolBar *this,QEvent *event)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  Type TVar5;
  int iVar6;
  int iVar7;
  QToolBarPrivate *tb;
  QWidget *popup;
  QStyle *pQVar8;
  ulong uVar9;
  QToolBarLayout *this_00;
  QEvent *in_RSI;
  QToolBarPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *w_1;
  QHoverEvent *e;
  QWidget *w;
  QToolBarPrivate *d;
  QWidget *in_stack_00000060;
  QStyleOptionToolBar opt;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  QToolBarPrivate *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff30;
  undefined1 uVar10;
  QToolBarLayout *in_stack_ffffffffffffff38;
  QWidget *in_stack_ffffffffffffff48;
  bool local_91;
  QCursor local_90;
  QPointF local_88;
  QPoint local_78;
  undefined1 local_70 [16];
  QMouseEvent *in_stack_ffffffffffffffa0;
  QToolBarPrivate *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tb = d_func((QToolBar *)0x6ed435);
  TVar5 = QEvent::type(in_RSI);
  auVar3._8_8_ = local_70._8_8_;
  auVar3._0_8_ = local_70._0_8_;
  auVar2._8_8_ = local_70._8_8_;
  auVar2._0_8_ = local_70._0_8_;
  if (TVar5 == Timer) {
    iVar6 = QBasicTimer::timerId((QBasicTimer *)0x6ed4f5);
    uVar10 = (undefined1)(TVar5 >> 0x18);
    iVar7 = QTimerEvent::timerId((QTimerEvent *)0x6ed503);
    if (iVar6 == iVar7) {
      popup = QApplication::activePopupWidget();
      bVar4 = waitForPopup((QToolBar *)tb,popup);
      if (!bVar4) {
        QBasicTimer::stop();
        bVar4 = QWidget::underMouse((QWidget *)0x6ed545);
        if (!bVar4) {
          QToolBarLayout::setExpanded(in_stack_ffffffffffffff38,(bool)uVar10);
        }
      }
    }
  }
  else if (TVar5 == MouseButtonPress) {
    bVar4 = QToolBarPrivate::mousePressEvent
                      (in_RDI,(QMouseEvent *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    if (bVar4) {
      local_91 = true;
      goto LAB_006ed815;
    }
  }
  else if (TVar5 == MouseButtonRelease) {
    bVar4 = QToolBarPrivate::mouseReleaseEvent
                      (in_stack_ffffffffffffff18,
                       (QMouseEvent *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10))
    ;
    if (bVar4) {
      local_91 = true;
      goto LAB_006ed815;
    }
  }
  else if (TVar5 == MouseMove) {
    bVar4 = QToolBarPrivate::mouseMoveEvent(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    if (bVar4) {
      local_91 = true;
      goto LAB_006ed815;
    }
  }
  else if (TVar5 == Leave) {
    if (((tb->state == (DragState *)0x0) || (local_70 = auVar3, (tb->state->dragging & 1U) == 0)) &&
       (local_70 = auVar2, ((tb->layout->super_QLayout).super_QLayoutItem.field_0xc & 1) != 0)) {
      this_00 = (QToolBarLayout *)QApplication::activePopupWidget();
      uVar10 = (undefined1)(TVar5 >> 0x18);
      bVar4 = waitForPopup((QToolBar *)tb,in_stack_ffffffffffffff48);
      if (bVar4) {
        QBasicTimer::start((QBasicTimer *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                           (int)((ulong)this_00 >> 0x20),(QObject *)in_stack_ffffffffffffff18);
      }
      else {
        QBasicTimer::stop();
        QToolBarLayout::setExpanded(this_00,(bool)uVar10);
      }
    }
  }
  else if (TVar5 == Show) {
LAB_006ed57a:
    uVar10 = SUB81(tb->toggleViewAction,0);
    QEvent::type(in_RSI);
    QAction::setChecked((bool)uVar10);
    QEvent::type(in_RSI);
    visibilityChanged((QToolBar *)0x6ed5cb,(bool)in_stack_ffffffffffffff0f);
  }
  else if (TVar5 == Hide) {
    bVar4 = QWidget::isHidden((QWidget *)0x6ed56f);
    if (bVar4) goto LAB_006ed57a;
  }
  else if (TVar5 == ParentChange) {
    QToolBarLayout::checkUsePopupMenu((QToolBarLayout *)CONCAT44(0x15,in_stack_ffffffffffffff30));
  }
  else {
    if (TVar5 - HoverEnter < 2) {
      local_91 = true;
      goto LAB_006ed815;
    }
    if (TVar5 == HoverMove) {
      memset(&stack0xffffffffffffffa0,0xaa,0x58);
      QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)0x6ed666);
      (**(code **)(*(long *)&in_RDI->super_QWidgetPrivate + 0x1a0))(in_RDI,&stack0xffffffffffffffa0)
      ;
      pQVar8 = QWidget::style((QWidget *)
                              CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
      local_70 = (**(code **)(*(long *)pQVar8 + 0xc0))(pQVar8,0x34,&stack0xffffffffffffffa0,in_RDI);
      local_88 = QSinglePointEvent::position((QSinglePointEvent *)0x6ed6be);
      local_78 = QPointF::toPoint((QPointF *)
                                  CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      uVar9 = QRect::contains((QPoint *)local_70,SUB81(&local_78,0));
      if ((uVar9 & 1) == 0) {
        QWidget::unsetCursor((QWidget *)in_stack_ffffffffffffff18);
      }
      else {
        QCursor::QCursor(&local_90,SizeAllCursor);
        QWidget::setCursor((QWidget *)in_RDI,
                           (QCursor *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))
        ;
        QCursor::~QCursor(&local_90);
      }
      QStyleOptionToolBar::~QStyleOptionToolBar((QStyleOptionToolBar *)0x6ed73a);
    }
  }
  local_91 = QWidget::event(in_stack_00000060,(QEvent *)this);
LAB_006ed815:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_91;
}

Assistant:

bool QToolBar::event(QEvent *event)
{
    Q_D(QToolBar);

    switch (event->type()) {
    case QEvent::Timer:
        if (d->waitForPopupTimer.timerId() == static_cast<QTimerEvent*>(event)->timerId()) {
            QWidget *w = QApplication::activePopupWidget();
            if (!waitForPopup(this, w)) {
                d->waitForPopupTimer.stop();
                if (!this->underMouse())
                    d->layout->setExpanded(false);
            }
        }
        break;
    case QEvent::Hide:
        if (!isHidden())
            break;
        Q_FALLTHROUGH();
    case QEvent::Show:
        d->toggleViewAction->setChecked(event->type() == QEvent::Show);
#ifdef Q_OS_MACOS
        enableMacToolBar(this, event->type() == QEvent::Show);
#endif
        emit visibilityChanged(event->type() == QEvent::Show);
        break;
    case QEvent::ParentChange:
        d->layout->checkUsePopupMenu();
        break;

    case QEvent::MouseButtonPress: {
        if (d->mousePressEvent(static_cast<QMouseEvent*>(event)))
            return true;
        break;
    }
    case QEvent::MouseButtonRelease:
        if (d->mouseReleaseEvent(static_cast<QMouseEvent*>(event)))
            return true;
        break;
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
        // there's nothing special to do here and we don't want to update the whole widget
        return true;
    case QEvent::HoverMove: {
#ifndef QT_NO_CURSOR
        QHoverEvent *e = static_cast<QHoverEvent*>(event);
        QStyleOptionToolBar opt;
        initStyleOption(&opt);
        if (style()->subElementRect(QStyle::SE_ToolBarHandle, &opt, this).contains(e->position().toPoint()))
            setCursor(Qt::SizeAllCursor);
        else
            unsetCursor();
#endif
        break;
    }
    case QEvent::MouseMove:
        if (d->mouseMoveEvent(static_cast<QMouseEvent*>(event)))
            return true;
        break;
    case QEvent::Leave:
        if (d->state != nullptr && d->state->dragging) {
#ifdef Q_OS_WIN
            // This is a workaround for losing the mouse on Vista.
            QPoint pos = QCursor::pos();
            QMouseEvent fake(QEvent::MouseMove, mapFromGlobal(pos), pos, Qt::NoButton,
                             QGuiApplication::mouseButtons(), QGuiApplication::keyboardModifiers());
            d->mouseMoveEvent(&fake);
#endif
        } else {
            if (!d->layout->expanded)
                break;

            QWidget *w = QApplication::activePopupWidget();
            if (waitForPopup(this, w)) {
                d->waitForPopupTimer.start(POPUP_TIMER_INTERVAL, this);
                break;
            }

            d->waitForPopupTimer.stop();
            d->layout->setExpanded(false);
            break;
        }
        break;
    default:
        break;
    }
    return QWidget::event(event);
}